

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O3

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  SFInstrumentZone *pSVar1;
  pointer puVar2;
  SFInstrument *pSVar3;
  SFInstrumentZone *pSVar4;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer puVar5;
  pointer puVar6;
  _Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false> local_48;
  SFInstrument *local_40;
  SFInstrument *local_38;
  
  pSVar1 = (this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>.
  _M_t.
  super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = (SFInstrumentZone *)0x0;
  if (pSVar1 != (SFInstrumentZone *)0x0) {
    (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
  }
  pSVar1 = (origin->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  if (pSVar1 != (SFInstrumentZone *)0x0) {
    pSVar4 = (SFInstrumentZone *)operator_new(0x50);
    SFInstrumentZone::SFInstrumentZone(pSVar4,pSVar1);
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
             .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
    ._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = pSVar4;
    if (pSVar1 != (SFInstrumentZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
    }
  }
  puVar6 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = puVar6;
  local_40 = this;
  local_38 = origin;
  if (puVar2 != puVar6) {
    do {
      pSVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
      if (pSVar1 != (SFInstrumentZone *)0x0) {
        (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      }
      (puVar5->_M_t).
      super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
      ._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
      .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
           (SFInstrumentZone *)0x0;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    (local_40->zones_).
    super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar6;
  }
  pSVar3 = local_38;
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::reserve(&this->zones_,
            (long)(local_38->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_38->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (pSVar3->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (pSVar3->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = local_40;
  for (; local_40 = pSVar3, puVar6 != puVar2; puVar6 = puVar6 + 1) {
    pSVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
             .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
    pSVar4 = (SFInstrumentZone *)operator_new(0x50);
    SFInstrumentZone::SFInstrumentZone(pSVar4,pSVar1);
    local_48._M_head_impl = pSVar4;
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>
              ((vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                *)&local_48);
    if (local_48._M_head_impl != (SFInstrumentZone *)0x0) {
      (*((local_48._M_head_impl)->super_SFZone)._vptr_SFZone[1])();
    }
    pSVar3 = local_40;
  }
  std::__cxx11::string::_M_assign((string *)pSVar3);
  pSVar3->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(pSVar3);
  return pSVar3;
}

Assistant:

SFInstrument & SFInstrument::operator=(const SFInstrument & origin) {
  // Copy global zone.
  global_zone_ = nullptr;
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFInstrumentZone>(origin.global_zone());
  }

  // Copy instrument zones.
  zones_.clear();
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFInstrumentZone>(*zone));
  }

  // Copy other fields.
  name_ = origin.name_;
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}